

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

char * big2_skipS(ENCODING *enc,char *ptr)

{
  byte bVar1;
  byte bVar2;
  
  do {
    bVar1 = *ptr;
    if (bVar1 < 0xdc) {
      bVar2 = 7;
      if (3 < bVar1 - 0xd8) {
        if (bVar1 == 0) {
          bVar2 = *(byte *)((long)enc[1].scanners + (ulong)((byte *)ptr)[1]);
        }
        else {
LAB_00182a35:
          bVar2 = 0x1d;
        }
      }
    }
    else if (bVar1 - 0xdc < 4) {
      bVar2 = 8;
    }
    else {
      if ((bVar1 != 0xff) || (((byte *)ptr)[1] < 0xfe)) goto LAB_00182a35;
      bVar2 = 0;
    }
    if ((0x15 < bVar2) || ((0x200600U >> (bVar2 & 0x1f) & 1) == 0)) {
      return ptr;
    }
    ptr = (char *)((byte *)ptr + 2);
  } while( true );
}

Assistant:

PREFIX(skipS)(const ENCODING *enc, const char *ptr) {
  for (;;) {
    switch (BYTE_TYPE(enc, ptr)) {
    case BT_LF:
    case BT_CR:
    case BT_S:
      ptr += MINBPC(enc);
      break;
    default:
      return ptr;
    }
  }
}